

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_aux.c
# Opt level: O1

int emptybuffer(luaL_Buffer *B)

{
  char *str;
  size_t len;
  
  str = B->buffer;
  len = (long)B->p - (long)str;
  if (len != 0) {
    lua_pushlstring(B->L,str,len);
    B->p = str;
    B->lvl = B->lvl + 1;
  }
  return (uint)(len != 0);
}

Assistant:

static int emptybuffer(luaL_Buffer *B)
{
  size_t l = bufflen(B);
  if (l == 0)
    return 0;  /* put nothing on stack */
  lua_pushlstring(B->L, B->buffer, l);
  B->p = B->buffer;
  B->lvl++;
  return 1;
}